

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stock.cpp
# Opt level: O2

void __thiscall L10_1::Stock::show(Stock *this)

{
  long lVar1;
  
  lVar1 = std::cout;
  *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
       *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) &
       0xfffffefb | 4;
  *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(lVar1 + -0x18)) = 3;
  std::operator<<((ostream *)&std::cout,"Company: ");
}

Assistant:

void Stock::show() {
    //  设置输出格式
    //  使用定点表示法，避免科学记数法
    std::ios_base::fmtflags origin_flag = std::cout.setf(std::ios_base::fixed, std::ios_base::floatfield);
    std::streamsize precision = std::cout.precision(3);

    std::cout << "Company: " << company << " Shares: " << shares << "\n";
    std::cout << " Shares Price: $" << share_val << " Total worth: $" << total_val << '\n';

    //  恢复之前设置的输出格式
    std::cout.setf(origin_flag, std::ios_base::floatfield);
    std::cout.precision(precision);
}